

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::~InnerMap
          (InnerMap *this)

{
  void **in_RDI;
  InnerMap *unaff_retaddr;
  InnerMap *in_stack_000000a0;
  void **t;
  
  if (in_RDI[4] != (void *)0x0) {
    t = in_RDI;
    clear(in_stack_000000a0);
    Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::Dealloc<void*>
              (unaff_retaddr,t,(size_type)in_RDI);
  }
  return;
}

Assistant:

~InnerMap() {
      if (table_ != NULL) {
        clear();
        Dealloc<void*>(table_, num_buckets_);
      }
    }